

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

int __thiscall
SslTcpSocketImpl::DatenDecode
          (SslTcpSocketImpl *this,uint8_t *buffer,size_t nAnzahl,bool *bZeroReceived)

{
  __array __n;
  bool bVar1;
  int iVar2;
  pointer pSVar3;
  size_t sVar4;
  type puVar5;
  type pSVar6;
  SSL *pSVar7;
  wchar_t *pwVar8;
  char *pOut;
  type __result;
  size_type sVar9;
  reference pvVar10;
  __tuple_element_t<0UL,_tuple<unique_ptr<unsigned_char[],_default_delete<unsigned_char[]>_>,_unsigned_long>_>
  *this_00;
  __tuple_element_t<1UL,_tuple<unique_ptr<unsigned_char[],_default_delete<unsigned_char[]>_>,_unsigned_long>_>
  *p_Var11;
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
  *this_01;
  wstring local_298;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_278;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_258;
  undefined1 local_238 [8];
  DATA data;
  size_t anz;
  __array temp_1;
  size_t nOutDataSize_1;
  unique_lock<std::mutex> lock1_1;
  bool bNewData_1;
  __array tmp;
  size_t len_1;
  int iErrorHint;
  __array Buffer;
  undefined1 local_1d0 [4];
  int iReturn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  wstring local_190;
  wstring local_170;
  wstring local_150;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_130;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_110;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b0;
  uint local_8c;
  size_t sStack_88;
  int iError;
  size_t len;
  __array temp;
  size_t nOutDataSize;
  unique_lock<std::mutex> lock1;
  bool bNewData;
  size_t nPut;
  unique_lock<std::mutex> lock;
  bool *bZeroReceived_local;
  size_t nAnzahl_local;
  uint8_t *buffer_local;
  SslTcpSocketImpl *this_local;
  
  if ((buffer == (uint8_t *)0x0) || (nAnzahl == 0)) {
    return 0;
  }
  lock._8_8_ = bZeroReceived;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&nPut,&this->m_mxEnDecode);
  pSVar3 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  sVar4 = OpenSSLWrapper::SslConnection::SslPutInData(pSVar3,buffer,nAnzahl);
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&nPut);
  if ((this->m_bCloseReq & 1U) == 1) {
    this_local._4_4_ = -1;
    goto LAB_001190c7;
  }
  pSVar3 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  iVar2 = OpenSSLWrapper::SslConnection::SSLGetShutdown(pSVar3);
  if (1 < iVar2) {
    pSVar3 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    OpenSSLWrapper::SslConnection::ShutDownConnection(pSVar3,(int *)0x0);
    (*(this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[2])();
    this_local._4_4_ = -1;
    goto LAB_001190c7;
  }
  pSVar3 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  iVar2 = OpenSSLWrapper::SslConnection::SslInitFinished(pSVar3);
  this->m_iSslInit = iVar2;
  if (this->m_iSslInit == 0) {
    pSVar3 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    iVar2 = OpenSSLWrapper::SslConnection::SSLDoHandshake(pSVar3);
    this->m_iSslInit = iVar2;
    lock1._15_1_ = 0;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&nOutDataSize,&this->m_mxEnDecode);
    pSVar3 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar3);
    while ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
           _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
      std::make_unique<unsigned_char[]>((size_t)&len);
      pSVar3 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len
                          ,0);
      sStack_88 = OpenSSLWrapper::SslConnection::SslGetOutData
                            (pSVar3,puVar5,
                             (size_t)temp._M_t.
                                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      if (sStack_88 != 0) {
        std::mutex::lock(&(this->super_TcpSocketImpl).m_mxOutDeque);
        std::__atomic_base<unsigned_long>::operator+=
                  (&(this->super_TcpSocketImpl).m_atOutBytes.super___atomic_base<unsigned_long>,
                   sStack_88);
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                  ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                    *)&(this->super_TcpSocketImpl).m_quOutData,
                   (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len,
                   &stack0xffffffffffffff78);
        std::mutex::unlock(&(this->super_TcpSocketImpl).m_mxOutDeque);
        lock1._15_1_ = 1;
      }
      pSVar3 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar3);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len);
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&nOutDataSize);
    if ((lock1._15_1_ & 1) == 1) {
      TcpSocketImpl::TriggerWriteThread(&this->super_TcpSocketImpl);
    }
    if (this->m_iSslInit < 1) {
      pSVar3 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      local_8c = OpenSSLWrapper::SslConnection::SSLGetError(pSVar3,this->m_iSslInit);
      if (local_8c == 2) goto LAB_0011897e;
      (this->super_TcpSocketImpl).super_BaseSocketImpl.m_iError = local_8c | 0x80000000;
      (this->super_TcpSocketImpl).super_BaseSocketImpl.m_iErrLoc = 0xe;
      std::__cxx11::to_wstring(&local_150,local_8c);
      std::operator+(&local_130,L"SSL_error: ",&local_150);
      std::operator+(&local_110,&local_130,L", after SSL_do_handshake returned: ");
      std::__cxx11::to_wstring(&local_170,this->m_iSslInit);
      std::operator+(&local_f0,&local_110,&local_170);
      std::operator+(&local_d0,&local_f0,L" on ssl context: ");
      pSVar6 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator*(&this->m_pSslCon);
      pSVar7 = OpenSSLWrapper::SslConnection::operator()(pSVar6);
      std::__cxx11::to_wstring(&local_190,(unsigned_long)pSVar7);
      std::operator+(&local_b0,&local_d0,&local_190);
      pwVar8 = (wchar_t *)std::__cxx11::wstring::c_str();
      OutputDebugString(pwVar8);
      std::__cxx11::wstring::~wstring((wstring *)&local_b0);
      std::__cxx11::wstring::~wstring((wstring *)&local_190);
      std::__cxx11::wstring::~wstring((wstring *)&local_d0);
      std::__cxx11::wstring::~wstring((wstring *)&local_f0);
      std::__cxx11::wstring::~wstring((wstring *)&local_170);
      std::__cxx11::wstring::~wstring((wstring *)&local_110);
      std::__cxx11::wstring::~wstring((wstring *)&local_130);
      std::__cxx11::wstring::~wstring((wstring *)&local_150);
      pSVar3 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      OpenSSLWrapper::SslConnection::GetSslErrAsString_abi_cxx11_((string *)local_1d0,pSVar3);
      std::operator+(&local_1b0,", msg: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0)
      ;
      pOut = (char *)std::__cxx11::string::c_str();
      OutputDebugStringA(pOut);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)local_1d0);
      bVar1 = std::function::operator_cast_to_bool
                        ((function *)&(this->super_TcpSocketImpl).super_BaseSocketImpl.m_fErrorParam
                        );
      if (bVar1) {
        std::function<void_(BaseSocket_*,_void_*)>::operator()
                  (&(this->super_TcpSocketImpl).super_BaseSocketImpl.m_fErrorParam,
                   (this->super_TcpSocketImpl).super_BaseSocketImpl.m_pBkRef,
                   (this->super_TcpSocketImpl).super_BaseSocketImpl.m_pvUserData);
      }
      else {
        bVar1 = std::function::operator_cast_to_bool
                          ((function *)&(this->super_TcpSocketImpl).super_BaseSocketImpl.m_fError);
        if (bVar1) {
          std::function<void_(BaseSocket_*)>::operator()
                    (&(this->super_TcpSocketImpl).super_BaseSocketImpl.m_fError,
                     (this->super_TcpSocketImpl).super_BaseSocketImpl.m_pBkRef);
        }
      }
      this_local._4_4_ = -1;
      bVar1 = true;
    }
    else {
      bVar1 = std::function::operator_cast_to_bool((function *)&this->m_fClientConnectedParam);
      if (bVar1) {
        std::function<void_(TcpSocket_*,_void_*)>::operator()
                  (&this->m_fClientConnectedParam,
                   (TcpSocket *)(this->super_TcpSocketImpl).super_BaseSocketImpl.m_pBkRef,
                   (this->super_TcpSocketImpl).super_BaseSocketImpl.m_pvUserData);
      }
      bVar1 = std::function::operator_cast_to_bool((function *)&this->m_fClientConnected);
      if (bVar1) {
        std::function<void_(TcpSocket_*)>::operator()
                  (&this->m_fClientConnected,
                   (TcpSocket *)(this->super_TcpSocketImpl).super_BaseSocketImpl.m_pBkRef);
      }
LAB_0011897e:
      bVar1 = false;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nOutDataSize);
    if (bVar1) goto LAB_001190c7;
  }
  Buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = -1;
  if (this->m_iSslInit == 1) {
    std::make_unique<unsigned_char[]>((size_t)&stack0xfffffffffffffe20);
    len_1._4_4_ = 0;
    pSVar3 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        &stack0xfffffffffffffe20,0);
    tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         OpenSSLWrapper::SslConnection::SslRead(pSVar3,puVar5,0xffff,(int *)((long)&len_1 + 4));
    while ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
           .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
      std::make_unique<unsigned_char[]>((size_t)&stack0xfffffffffffffe08);
      puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &stack0xfffffffffffffe20,0);
      __n = tmp;
      __result = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            &stack0xfffffffffffffe08,0);
      std::copy_n<unsigned_char*,unsigned_long,unsigned_char*>
                (puVar5,(unsigned_long)
                        __n._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,__result);
      std::mutex::lock(&(this->super_TcpSocketImpl).m_mxInDeque);
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
      ::
      emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                  *)&(this->super_TcpSocketImpl).m_quInData,
                 (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 &stack0xfffffffffffffe08,(unsigned_long *)&tmp);
      std::__atomic_base<unsigned_long>::operator+=
                (&(this->super_TcpSocketImpl).m_atInBytes.super___atomic_base<unsigned_long>,
                 (__int_type)
                 tmp._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      std::mutex::unlock(&(this->super_TcpSocketImpl).m_mxInDeque);
      Buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 1;
      pSVar3 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &stack0xfffffffffffffe20,0);
      tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           OpenSSLWrapper::SslConnection::SslRead(pSVar3,puVar5,0xffff,(int *)((long)&len_1 + 4));
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 &stack0xfffffffffffffe08);
    }
    lock1_1._15_1_ = 0;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&nOutDataSize_1,&this->m_mxEnDecode);
    pSVar3 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar3);
    while ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
           _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
      std::make_unique<unsigned_char[]>((size_t)&anz);
      pSVar3 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&anz
                          ,0);
      data.
      super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
      .
      super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
      ._M_head_impl._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
      ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           OpenSSLWrapper::SslConnection::SslGetOutData
                     (pSVar3,puVar5,
                      (size_t)temp_1._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      if ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
          data.
          super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
          .
          super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
          ._M_head_impl._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
        std::mutex::lock(&(this->super_TcpSocketImpl).m_mxOutDeque);
        std::__atomic_base<unsigned_long>::operator+=
                  (&(this->super_TcpSocketImpl).m_atOutBytes.super___atomic_base<unsigned_long>,
                   (__int_type)
                   data.
                   super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                   .
                   super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
                   ._M_head_impl._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                  ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                    *)&(this->super_TcpSocketImpl).m_quOutData,
                   (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&anz,
                   (unsigned_long *)
                   &data.
                    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                    .
                    super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
                  );
        std::mutex::unlock(&(this->super_TcpSocketImpl).m_mxOutDeque);
        lock1_1._15_1_ = 1;
      }
      pSVar3 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar3);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&anz);
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&nOutDataSize_1);
    if ((lock1_1._15_1_ & 1) == 1) {
      TcpSocketImpl::TriggerWriteThread(&this->super_TcpSocketImpl);
    }
    std::mutex::lock(&(this->super_TcpSocketImpl).m_mxOutDeque);
    while (sVar9 = std::
                   deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                   ::size(&(this->super_TcpSocketImpl).m_quTmpOutData), sVar9 != 0) {
      this_01 = &(this->super_TcpSocketImpl).m_quTmpOutData;
      pvVar10 = std::
                deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                ::front(this_01);
      std::
      tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
      ::tuple((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
               *)local_238,pvVar10);
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
      ::pop_front(this_01);
      std::mutex::unlock(&(this->super_TcpSocketImpl).m_mxOutDeque);
      this_00 = std::
                get<0ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                          ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                            *)local_238);
      puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (this_00,0);
      p_Var11 = std::
                get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                          ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                            *)local_238);
      (*(this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[0x14])
                (this,puVar5,*p_Var11);
      std::mutex::lock(&(this->super_TcpSocketImpl).m_mxOutDeque);
      std::
      tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
      ::~tuple((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                *)local_238);
    }
    std::mutex::unlock(&(this->super_TcpSocketImpl).m_mxOutDeque);
    pSVar3 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    bVar1 = OpenSSLWrapper::SslConnection::GetZeroReceived(pSVar3);
    *(bool *)lock._8_8_ = bVar1;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nOutDataSize_1);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               &stack0xfffffffffffffe20);
  }
  if ((sVar4 == 0) || (sVar4 == nAnzahl)) {
    this_local._4_4_ =
         Buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
         _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_;
  }
  else {
    pSVar6 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator*(&this->m_pSslCon);
    pSVar7 = OpenSSLWrapper::SslConnection::operator()(pSVar6);
    std::__cxx11::to_wstring(&local_298,(unsigned_long)pSVar7);
    std::operator+(&local_278,L"SslPutInData konnte nicht alles fassen on ssl context: ",&local_298)
    ;
    std::operator+(&local_258,&local_278,L"\r\n");
    pwVar8 = (wchar_t *)std::__cxx11::wstring::c_str();
    OutputDebugString(pwVar8);
    std::__cxx11::wstring::~wstring((wstring *)&local_258);
    std::__cxx11::wstring::~wstring((wstring *)&local_278);
    std::__cxx11::wstring::~wstring((wstring *)&local_298);
    this_local._4_4_ = DatenDecode(this,buffer + sVar4,nAnzahl - sVar4,(bool *)lock._8_8_);
  }
LAB_001190c7:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nPut);
  return this_local._4_4_;
}

Assistant:

int SslTcpSocketImpl::DatenDecode(const uint8_t* buffer, size_t nAnzahl, bool& bZeroReceived)
{
    if (buffer == nullptr || nAnzahl == 0)
        return 0;

    unique_lock<mutex> lock(m_mxEnDecode);
    const size_t nPut = m_pSslCon->SslPutInData(reinterpret_cast<const uint8_t*>(buffer), nAnzahl);
    lock.unlock();

    if (m_bCloseReq == true)
        return -1;

    if (m_pSslCon->SSLGetShutdown() >= SSL_RECEIVED_SHUTDOWN)
    {
        m_pSslCon->ShutDownConnection();
        Close();
        return -1;
    }

    m_iSslInit = m_pSslCon->SslInitFinished();
    if (m_iSslInit == 0)
    {
        m_iSslInit = m_pSslCon->SSLDoHandshake();

        bool bNewData = false;
        unique_lock<mutex> lock1(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (len > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += len;
                m_quOutData.emplace_back(move(temp), len);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock1.unlock();

        if (bNewData == true)
            TriggerWriteThread();

        if (m_iSslInit <= 0)
        {
            const int iError = m_pSslCon->SSLGetError(m_iSslInit);
            if (iError != SSL_ERROR_WANT_READ)
            {
                m_iError = 0x80000000 | iError;
                m_iErrLoc = 14;
                OutputDebugString(wstring(L"SSL_error: " + to_wstring(iError) + L", after SSL_do_handshake returned: " + to_wstring(m_iSslInit) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)()))).c_str());
                OutputDebugStringA(string(", msg: " + m_pSslCon->GetSslErrAsString()).c_str());
                if (m_fErrorParam)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError)
                    m_fError(m_pBkRef);
                return -1;
            }
        }
        else
        {
            if (m_fClientConnectedParam)
                m_fClientConnectedParam(reinterpret_cast<SslTcpSocket*>(m_pBkRef), m_pvUserData);
            if (m_fClientConnected)
                m_fClientConnected(reinterpret_cast<SslTcpSocket*>(m_pBkRef));
        }
    }

    int iReturn = -1;
    if (m_iSslInit == 1)
    {
        auto Buffer = make_unique<uint8_t[]>(0x0000ffff);
        int iErrorHint = 0;
        size_t len = m_pSslCon->SslRead(&Buffer[0], 0x0000ffff, &iErrorHint); // get receive data from the SSL layer, and put it into the unencrypted receive Que
        while (len > 0)
        {
            auto tmp = make_unique<uint8_t[]>(len);
            copy_n(&Buffer[0], len, &tmp[0]);
            m_mxInDeque.lock();
            m_quInData.emplace_back(move(tmp), len);
            m_atInBytes += len;
            m_mxInDeque.unlock();
            iReturn = 1;

            len = m_pSslCon->SslRead(&Buffer[0], 0x0000ffff, &iErrorHint); // get receive data from the SSL layer, and put it into the unencrypted receive Que
        }

        bool bNewData = false;
        unique_lock<mutex> lock1(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            size_t anz = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (anz > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += anz;
                m_quOutData.emplace_back(move(temp), anz);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock1.unlock();

        if (bNewData == true)
            TriggerWriteThread();

        m_mxOutDeque.lock();
        while (m_quTmpOutData.size() > 0)
        {
            DATA data = move(m_quTmpOutData.front());
            m_quTmpOutData.pop_front();
            m_mxOutDeque.unlock();
            Write((&BUFFER(data)[0]), BUFLEN(data));
            m_mxOutDeque.lock();
        }
        m_mxOutDeque.unlock();
        bZeroReceived = m_pSslCon->GetZeroReceived();
    }

    if (nPut != 0 && nPut != nAnzahl)
    {
        OutputDebugString(wstring(L"SslPutInData konnte nicht alles fassen on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
        return DatenDecode(&buffer[nPut], nAnzahl - nPut, bZeroReceived);
    }

    return iReturn;
}